

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void nmea_sentence_received(char *sentence,uint length,uchar sentences,uchar sentencenum)

{
  ssize_t sVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  if ((int)CONCAT71(in_register_00000011,sentences) == 1) {
    sVar1 = sendto(sock,sentence,(ulong)length,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
    if (sVar1 == -1) {
LAB_001027be:
      abort();
    }
    if (debug_nmea == '\x01') {
      fputs(sentence,_stderr);
      return;
    }
  }
  else {
    uVar2 = buffer_count + length;
    if (uVar2 < 0x800) {
      memcpy(buffer + buffer_count,sentence,(ulong)length);
      if (uVar2 == 0 || sentences != sentencenum) {
        buffer_count = uVar2;
        return;
      }
      buffer_count = uVar2;
      sVar1 = sendto(sock,buffer,(ulong)uVar2,0,(sockaddr *)addr->ai_addr,addr->ai_addrlen);
      if (sVar1 == -1) goto LAB_001027be;
      if (debug_nmea == '\x01') {
        nmea_sentence_received_cold_1();
      }
    }
    buffer_count = 0;
  }
  return;
}

Assistant:

void nmea_sentence_received(const char *sentence,
                          unsigned int length,
                          unsigned char sentences,
                          unsigned char sentencenum) {
    if (sentences == 1) {
        if (sendto(sock, sentence, length, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
        if (debug_nmea) fprintf(stderr, "%s", sentence);
    } else {
        if (buffer_count + length < MAX_BUFFER_LENGTH) {
            memcpy(&buffer[buffer_count], sentence, length);
            buffer_count += length;
        } else {
            buffer_count=0;
        }

        if (sentences == sentencenum && buffer_count > 0) {
            if (sendto(sock, buffer, buffer_count, 0, addr->ai_addr, addr->ai_addrlen) == -1) abort();
            if (debug_nmea) fprintf(stderr, "%s", buffer);
            buffer_count=0;
        };
    }
}